

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_Interval __thiscall
ON_PlaneEquation::ValueRange(ON_PlaneEquation *this,size_t point_list_count,ON_3fPoint *point_list)

{
  ON_Interval OVar1;
  undefined1 local_48 [8];
  ON_3dPointListRef vertex_list;
  ON_3fPoint *point_list_local;
  size_t point_list_count_local;
  ON_PlaneEquation *this_local;
  
  vertex_list.m_fP = &point_list->x;
  ON_3dPointListRef::ON_3dPointListRef((ON_3dPointListRef *)local_48);
  ON_3dPointListRef::SetFromFloatArray
            ((ON_3dPointListRef *)local_48,point_list_count,3,vertex_list.m_fP);
  OVar1 = ValueRange(this,(ON_3dPointListRef *)local_48);
  return (ON_Interval)OVar1.m_t;
}

Assistant:

ON_Interval ON_PlaneEquation::ValueRange(
  size_t point_list_count,
  const ON_3fPoint* point_list
  ) const
{
  ON_3dPointListRef vertex_list;
  vertex_list.SetFromFloatArray(point_list_count,3,(const float*)point_list);
  return ValueRange(vertex_list);
}